

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask18_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = in[1];
  uVar2 = in[3];
  auVar6._8_8_ = 0xe0000001c;
  auVar6._0_8_ = 0xe0000001c;
  uVar3 = in[0x14];
  *out = uVar1 << 0x12 | *in;
  uVar4 = in[5];
  out[1] = uVar2 << 0x16 | in[2] << 4 | uVar1 >> 0xe;
  uVar5 = in[6];
  out[2] = uVar4 << 0x1a | in[4] << 8 | uVar2 >> 10;
  uVar1 = in[7];
  uVar2 = in[8];
  out[3] = uVar1 << 0x1e | uVar5 << 0xc | uVar4 >> 6;
  uVar4 = in[10];
  out[4] = uVar2 << 0x10 | uVar1 >> 2;
  uVar1 = in[0xc];
  out[5] = uVar4 << 0x14 | in[9] << 2 | uVar2 >> 0x10;
  uVar5 = in[0xd];
  out[6] = uVar1 << 0x18 | in[0xb] << 6 | uVar4 >> 0xc;
  uVar2 = in[0x13];
  uVar4 = in[0x11];
  auVar8 = vpinsrd_avx(ZEXT416(uVar5 << 10 | uVar1 >> 8),
                       (uint)(*(ulong *)(in + 0xe) >> 4) & 0xfffffff,1);
  uVar1 = in[0x10];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(in + 0xe);
  auVar7 = vpsllvd_avx2(auVar7,auVar6);
  auVar8 = vpor_avx(auVar7,auVar8);
  *(long *)(out + 7) = auVar8._0_8_;
  out[9] = uVar4 << 0x12 | uVar1;
  uVar1 = in[0x15];
  out[10] = uVar2 << 0x16 | in[0x12] << 4 | uVar4 >> 0xe;
  uVar5 = in[0x16];
  uVar4 = in[0x18];
  out[0xb] = uVar1 << 0x1a | uVar3 << 8 | uVar2 >> 10;
  uVar2 = in[0x17];
  out[0xc] = uVar2 << 0x1e | uVar5 << 0xc | uVar1 >> 6;
  uVar1 = in[0x1a];
  out[0xd] = uVar4 << 0x10 | uVar2 >> 2;
  uVar3 = in[0x1b];
  uVar2 = in[0x1c];
  out[0xe] = uVar1 << 0x14 | in[0x19] << 2 | uVar4 >> 0x10;
  out[0xf] = uVar2 << 0x18 | uVar3 << 6 | uVar1 >> 0xc;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(in + 0x1e);
  auVar7 = vpsllvd_avx2(auVar8,auVar6);
  auVar8 = vpinsrd_avx(ZEXT416(in[0x1d] << 10 | uVar2 >> 8),
                       (uint)(*(ulong *)(in + 0x1e) >> 4) & 0xfffffff,1);
  auVar8 = vpor_avx(auVar7,auVar8);
  *(long *)(out + 0x10) = auVar8._0_8_;
  return out + 0x12;
}

Assistant:

uint32_t *__fastpackwithoutmask18_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (18 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (18 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (18 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (18 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (18 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (18 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (18 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (18 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  ++in;

  return out;
}